

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

uint32_t __thiscall
cfd::ConfidentialTransactionContext::UpdateFeeAmount
          (ConfidentialTransactionContext *this,Amount *value,ConfidentialAssetId *asset)

{
  uint32_t index;
  bool bVar1;
  Amount result;
  uint32_t local_b4;
  ByteData local_b0;
  ByteData local_98;
  ConfidentialNonce local_80;
  ConfidentialValue local_58;
  Amount local_30;
  
  core::Amount::Amount(&local_30);
  local_b4 = 0;
  bVar1 = IsFindFeeTxOut(this,&local_b4);
  index = local_b4;
  if (bVar1) {
    core::ConfidentialValue::ConfidentialValue(&local_58,value);
    core::ConfidentialNonce::ConfidentialNonce(&local_80);
    core::ByteData::ByteData(&local_b0);
    core::ByteData::ByteData(&local_98);
    core::ConfidentialTransaction::SetTxOutCommitment
              (&this->super_ConfidentialTransaction,index,asset,&local_58,&local_80,&local_b0,
               &local_98);
    if (local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_80._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0086dcb8;
    if (local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_58._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0086dde8;
    if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    local_b4 = core::ConfidentialTransaction::AddTxOutFee
                         (&this->super_ConfidentialTransaction,value,asset);
  }
  return local_b4;
}

Assistant:

uint32_t ConfidentialTransactionContext::UpdateFeeAmount(
    const Amount& value, const ConfidentialAssetId& asset) {
  Amount result;
  uint32_t index = 0;
  if (IsFindFeeTxOut(&index)) {
    SetTxOutCommitment(
        index, asset, ConfidentialValue(value), ConfidentialNonce(),
        ByteData(), ByteData());
  } else {
    index = AddTxOutFee(value, asset);
  }
  return index;
}